

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall S2Builder::AddForcedSites(S2Builder *this,S2PointIndex<int> *site_index)

{
  pointer pVVar1;
  int iVar2;
  undefined8 in_RAX;
  __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
  __first;
  ulong uVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::
  __sort<__gnu_cxx::__normal_iterator<Vector3<double>*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<Vector3<double>*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      ((this->sites_).
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (this->sites_).
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::erase
            (&this->sites_,(const_iterator)__first._M_current,
             (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  iVar2 = 0;
  while( true ) {
    uStack_28 = CONCAT44(iVar2,(undefined4)uStack_28);
    pVVar1 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->sites_).
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pVVar1) / 0x18;
    if (uVar3 <= (ulong)(long)iVar2) break;
    S2PointIndex<int>::Add(site_index,pVVar1 + iVar2,(int *)((long)&uStack_28 + 4));
    iVar2 = uStack_28._4_4_ + 1;
  }
  this->num_forced_sites_ = (SiteId)uVar3;
  return;
}

Assistant:

void S2Builder::AddForcedSites(S2PointIndex<SiteId>* site_index) {
  // Sort the forced sites and remove duplicates.
  std::sort(sites_.begin(), sites_.end());
  sites_.erase(std::unique(sites_.begin(), sites_.end()), sites_.end());
  // Add the forced sites to the index.
  for (SiteId id = 0; id < sites_.size(); ++id) {
    site_index->Add(sites_[id], id);
  }
  num_forced_sites_ = sites_.size();
}